

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp.c
# Opt level: O1

_Bool uo_tcp_init(void)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (!is_init) {
    is_init = true;
    _Var1 = uo_cb_init();
    is_init = (_Bool)(is_init & _Var1);
    _Var1 = uo_sock_init();
    is_init = (_Bool)(is_init & _Var1);
    _Var1 = uo_io_init();
    _Var1 = (_Bool)(_Var1 & is_init);
    is_init = _Var1;
  }
  return _Var1;
}

Assistant:

bool uo_tcp_init(void)
{
    if (is_init)
        return is_init;

    is_init = true;

    is_init &= uo_cb_init();
    is_init &= uo_sock_init();
    is_init &= uo_io_init();

    return is_init;
}